

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcPolyLoop>
                 (DB *db,LIST *params,IfcPolyLoop *in)

{
  size_t sVar1;
  TypeError *this;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcPolyLoop *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcPolyLoop *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcLoop>(db,params,&in->super_IfcLoop);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 != 0) {
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
    GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,3ul,0ul>
              ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL> *)
               (base + 0x40),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,
               (DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
    return local_28;
  }
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"expected 1 arguments to IfcPolyLoop",&local_49);
  TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

size_t GenericFill<IfcPolyLoop>(const DB& db, const LIST& params, IfcPolyLoop* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcLoop*>(in));
	if (params.GetSize() < 1) { throw STEP::TypeError("expected 1 arguments to IfcPolyLoop"); }    do { // convert the 'Polygon' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Polygon, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcPolyLoop to be a `LIST [3:?] OF IfcCartesianPoint`")); }
    } while(0);
	return base;
}